

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_client_link.cpp
# Opt level: O1

void __thiscall miniros::ServiceClientLink::ServiceClientLink(ServiceClientLink *this)

{
  DropWatcher *pDVar1;
  DropWatcher *this_00;
  
  (this->super_enable_shared_from_this<miniros::ServiceClientLink>)._M_weak_this.
  super___weak_ptr<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<miniros::ServiceClientLink>)._M_weak_this.
  super___weak_ptr<miniros::ServiceClientLink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_ServiceClientLink = (_func_int **)&PTR__ServiceClientLink_002ac450;
  (this->drop_watcher_)._M_t.
  super___uniq_ptr_impl<miniros::ServiceClientLink::DropWatcher,_std::default_delete<miniros::ServiceClientLink::DropWatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_miniros::ServiceClientLink::DropWatcher_*,_std::default_delete<miniros::ServiceClientLink::DropWatcher>_>
  .super__Head_base<0UL,_miniros::ServiceClientLink::DropWatcher_*,_false>._M_head_impl =
       (DropWatcher *)0x0;
  (this->connection_).super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->connection_).super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->parent_).super___weak_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->parent_).super___weak_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->persistent_ = false;
  this_00 = (DropWatcher *)operator_new(0x28);
  observer::Connection::Connection((Connection *)this_00);
  (this_00->super_DropWatcher).super_Connection._vptr_Connection = &PTR__Connection_002ac4f8;
  this_00->owner_ = this;
  pDVar1 = (this->drop_watcher_)._M_t.
           super___uniq_ptr_impl<miniros::ServiceClientLink::DropWatcher,_std::default_delete<miniros::ServiceClientLink::DropWatcher>_>
           ._M_t.
           super__Tuple_impl<0UL,_miniros::ServiceClientLink::DropWatcher_*,_std::default_delete<miniros::ServiceClientLink::DropWatcher>_>
           .super__Head_base<0UL,_miniros::ServiceClientLink::DropWatcher_*,_false>._M_head_impl;
  (this->drop_watcher_)._M_t.
  super___uniq_ptr_impl<miniros::ServiceClientLink::DropWatcher,_std::default_delete<miniros::ServiceClientLink::DropWatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_miniros::ServiceClientLink::DropWatcher_*,_std::default_delete<miniros::ServiceClientLink::DropWatcher>_>
  .super__Head_base<0UL,_miniros::ServiceClientLink::DropWatcher_*,_false>._M_head_impl = this_00;
  if (pDVar1 != (DropWatcher *)0x0) {
    (**(code **)(*(long *)&(pDVar1->super_DropWatcher).super_Connection + 8))();
    return;
  }
  return;
}

Assistant:

ServiceClientLink::ServiceClientLink()
: persistent_(false)
{
    drop_watcher_ = std::make_unique<DropWatcher>(*this);
}